

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmnutils.h
# Opt level: O0

void __thiscall JSMNUtilsEx::JSMNUtilsEx(JSMNUtilsEx *this,string *errmsg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *errmsg_local;
  JSMNUtilsEx *this_local;
  
  local_18 = errmsg;
  errmsg_local = (string *)this;
  std::operator+(&local_38,"jsmnutils error: ",errmsg);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__JSMNUtilsEx_0011bd70;
  return;
}

Assistant:

JSMNUtilsEx(std::string errmsg) :
        std::runtime_error("jsmnutils error: " + errmsg) {}